

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

deUint32 tcu::anon_unknown_75::readUint32High24(deUint8 *src)

{
  deUint32 dVar1;
  deUint32 uint32ByteOffset8To32;
  deUint8 *src_local;
  
  dVar1 = readUint24(src + 1);
  return dVar1;
}

Assistant:

inline deUint32 readUint32High24 (const deUint8* src)
{
#if (DE_ENDIANNESS == DE_LITTLE_ENDIAN)
	const deUint32 uint32ByteOffset8To32	= 1;
#else
	const deUint32 uint32ByteOffset8To32	= 0;
#endif

	return readUint24(src + uint32ByteOffset8To32);
}